

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

int addr_eliminable_p(gen_ctx_t gen_ctx,bb_insn_t_conflict bb_insn,VARR_bb_insn_t *bb_mem_insns)

{
  bitmap_t pVVar1;
  size_t sVar2;
  FILE *pFVar3;
  gen_ctx *pgVar4;
  int iVar5;
  int iVar6;
  int extraout_EAX;
  char *pcVar7;
  ulong uVar8;
  VARR_bb_insn_t *pVVar9;
  bb_insn_t_conflict bb_insn_00;
  gen_ctx_t pgVar10;
  
  pVVar1 = gen_ctx->temp_bitmap2;
  if ((pVVar1 == (bitmap_t)0x0) || (pVVar1->varr == (bitmap_el_t *)0x0)) {
LAB_001619f1:
    addr_eliminable_p_cold_5();
  }
  else {
    pVVar1->els_num = 0;
    pVVar9 = gen_ctx->temp_bb_insns2;
    if ((pVVar9 != (VARR_bb_insn_t *)0x0) && (pVVar9->varr != (bb_insn_t_conflict *)0x0)) {
      pVVar9->els_num = 0;
      if (bb_mem_insns == (VARR_bb_insn_t *)0x0) {
        bb_insn_00 = (bb_insn_t_conflict)bb_insn->insn;
        pVVar9 = (VARR_bb_insn_t *)0x0;
      }
      else {
        if (bb_mem_insns->varr == (bb_insn_t_conflict *)0x0) goto LAB_001619fb;
        bb_mem_insns->els_num = 0;
        bb_insn_00 = (bb_insn_t_conflict)bb_insn->insn;
        pVVar9 = bb_mem_insns;
      }
      pgVar10 = gen_ctx;
      iVar5 = collect_addr_uses(gen_ctx,bb_insn_00,pVVar9);
      while (pVVar9 = gen_ctx->temp_bb_insns2, pVVar9 != (VARR_bb_insn_t *)0x0) {
        sVar2 = pVVar9->els_num;
        if (sVar2 == 0) {
          return iVar5;
        }
        if (pVVar9->varr == (bb_insn_t_conflict *)0x0) goto LAB_001619ec;
        pVVar9->els_num = sVar2 - 1;
        pgVar10 = gen_ctx;
        iVar6 = collect_addr_uses(gen_ctx,(bb_insn_t_conflict)pVVar9->varr[sVar2 - 1]->insn,
                                  bb_mem_insns);
        if (iVar6 == 0) {
          iVar5 = 0;
        }
      }
      addr_eliminable_p_cold_3();
LAB_001619ec:
      gen_ctx = pgVar10;
      addr_eliminable_p_cold_2();
      goto LAB_001619f1;
    }
  }
  addr_eliminable_p_cold_4();
LAB_001619fb:
  addr_eliminable_p_cold_1();
  pFVar3 = gen_ctx->debug_file;
  if (pFVar3 == (FILE *)0x0) {
    uVar8 = (ulong)((uint)*(ushort *)((long)&gen_ctx->curr_func_item + 2) * 0x30);
    if (*(gen_ctx_t *)(**(long **)&gen_ctx->optimize_level + 0x20 + uVar8) != gen_ctx) {
      __assert_fail("op_ref->data == ssa_edge",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x965,"void remove_ssa_edge(ssa_edge_t)");
    }
    pcVar7 = *(char **)&gen_ctx->debug_level;
    *(char **)(**(long **)&gen_ctx->optimize_level + 0x20 + uVar8) = pcVar7;
  }
  else {
    pcVar7 = *(char **)&gen_ctx->debug_level;
    pFVar3->_IO_write_base = pcVar7;
  }
  if (pcVar7 != (char *)0x0) {
    *(FILE **)(pcVar7 + 0x18) = pFVar3;
  }
  uVar8 = (ulong)*(uint *)((long)&gen_ctx->curr_func_item + 4);
  pgVar4 = gen_ctx->ctx->gen_ctx;
  if ((gen_ctx_t)pgVar4->call_used_hard_regs[uVar8 * 6 + -9] != gen_ctx) {
    __assert_fail("ssa_edge->use->insn->ops[ssa_edge->use_op_num].data == ssa_edge",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x969,"void remove_ssa_edge(ssa_edge_t)");
  }
  pgVar4->call_used_hard_regs[uVar8 * 6 + -9] = (bitmap_t)0x0;
  free(gen_ctx);
  return extraout_EAX;
}

Assistant:

static int addr_eliminable_p (gen_ctx_t gen_ctx, bb_insn_t bb_insn,
                              VARR (bb_insn_t) * bb_mem_insns) {
  int res = TRUE;

  bitmap_clear (temp_bitmap2);
  VARR_TRUNC (bb_insn_t, temp_bb_insns2, 0);
  if (bb_mem_insns != NULL) VARR_TRUNC (bb_insn_t, bb_mem_insns, 0);
  if (!collect_addr_uses (gen_ctx, bb_insn, bb_mem_insns)) res = FALSE;
  while (VARR_LENGTH (bb_insn_t, temp_bb_insns2) != 0) {
    bb_insn_t copy_bb_insn = VARR_POP (bb_insn_t, temp_bb_insns2);
    if (!collect_addr_uses (gen_ctx, copy_bb_insn, bb_mem_insns)) res = FALSE;
  }
  return res;
}